

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwtran.c
# Opt level: O2

void png_do_write_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  png_byte pVar1;
  byte bVar2;
  byte bVar3;
  png_uint_32 pVar4;
  size_t sVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  png_bytep ppVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  png_bytep ppVar13;
  png_byte pVar14;
  ushort *puVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  size_t sVar22;
  undefined1 auVar23 [16];
  uint uStack_70;
  uint local_68 [4];
  int shift_start [4];
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  uVar19 = png_ptr->transformations;
  if (((uVar19 >> 0x14 & 1) != 0) &&
     (png_ptr->write_user_transform_fn != (png_user_transform_ptr)0x0)) {
    (*png_ptr->write_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
    uVar19 = png_ptr->transformations;
  }
  if ((short)uVar19 < 0) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,(uint)(-1 < (char)png_ptr->flags));
    uVar19 = png_ptr->transformations;
  }
  if ((uVar19 >> 0x10 & 1) != 0) {
    png_do_packswap(row_info,png_ptr->row_buf + 1);
    uVar19 = png_ptr->transformations;
  }
  if ((((uVar19 & 4) == 0) || (row_info->bit_depth != '\b')) || (row_info->channels != '\x01'))
  goto LAB_00121c8c;
  ppVar9 = png_ptr->row_buf + 1;
  pVar1 = png_ptr->bit_depth;
  ppVar13 = ppVar9;
  if (pVar1 == '\x04') {
    pVar4 = row_info->width;
    iVar18 = 4;
    uVar19 = 0;
    for (lVar16 = 0; pVar14 = (png_byte)uVar19, pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
      uVar19 = (ppVar9[lVar16] & 0xf) << ((byte)iVar18 & 0x1f) | uVar19;
      if (iVar18 == 0) {
        *ppVar13 = (png_byte)uVar19;
        ppVar13 = ppVar13 + 1;
        uVar19 = 0;
        iVar18 = 4;
      }
      else {
        iVar18 = iVar18 + -4;
      }
    }
    if (iVar18 != 4) {
LAB_00121c52:
      *ppVar13 = pVar14;
    }
  }
  else if (pVar1 == '\x02') {
    pVar4 = row_info->width;
    iVar18 = 6;
    uVar19 = 0;
    for (lVar16 = 0; pVar14 = (png_byte)uVar19, pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
      uVar19 = (ppVar9[lVar16] & 3) << ((byte)iVar18 & 0x1f) | uVar19;
      if (iVar18 == 0) {
        *ppVar13 = (png_byte)uVar19;
        ppVar13 = ppVar13 + 1;
        uVar19 = 0;
        iVar18 = 6;
      }
      else {
        iVar18 = iVar18 + -2;
      }
    }
    if (iVar18 != 6) goto LAB_00121c52;
  }
  else if (pVar1 == '\x01') {
    pVar4 = row_info->width;
    uVar17 = 0x80;
    uVar19 = 0;
    for (lVar16 = 0; pVar14 = (png_byte)uVar19, pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
      uVar21 = 0;
      if (ppVar9[lVar16] != '\0') {
        uVar21 = uVar17;
      }
      uVar19 = uVar21 | uVar19;
      if (uVar17 < 2) {
        *ppVar13 = (png_byte)uVar19;
        ppVar13 = ppVar13 + 1;
        uVar17 = 0x80;
        uVar19 = 0;
      }
      else {
        uVar17 = uVar17 >> 1;
      }
    }
    if (uVar17 != 0x80) goto LAB_00121c52;
  }
  row_info->bit_depth = pVar1;
  bVar6 = row_info->channels * pVar1;
  row_info->pixel_depth = bVar6;
  if (bVar6 < 8) {
    uVar10 = (ulong)row_info->width * (ulong)bVar6 + 7 >> 3;
  }
  else {
    uVar10 = (ulong)row_info->width * (ulong)(bVar6 >> 3);
  }
  row_info->rowbytes = uVar10;
  uVar19 = png_ptr->transformations;
LAB_00121c8c:
  if ((uVar19 & 0x10) != 0) {
    png_do_swap(row_info,png_ptr->row_buf + 1);
    uVar19 = png_ptr->transformations;
  }
  if (((uVar19 & 8) != 0) && (bVar6 = row_info->color_type, bVar6 != 3)) {
    bVar2 = row_info->bit_depth;
    if ((bVar6 & 2) == 0) {
      bVar3 = (png_ptr->shift).gray;
      uStack_70 = 1;
    }
    else {
      bVar3 = (png_ptr->shift).red;
      local_68[1] = (uint)(png_ptr->shift).green;
      shift_start[1] = bVar2 - local_68[1];
      local_68[2] = (uint)(png_ptr->shift).blue;
      shift_start[2] = bVar2 - local_68[2];
      uStack_70 = 3;
    }
    ppVar13 = png_ptr->row_buf;
    uVar17 = (uint)bVar3;
    uVar19 = (uint)bVar2;
    iVar18 = uVar19 - bVar3;
    shift_start[0] = iVar18;
    local_68[0] = (uint)bVar3;
    if ((bVar6 & 4) != 0) {
      uVar21 = (uint)(png_ptr->shift).alpha;
      *(uint *)((long)shift_start + (ulong)(uStack_70 * 4)) = uVar19 - uVar21;
      *(uint *)((long)local_68 + (ulong)(uStack_70 * 4)) = uVar21;
      uStack_70 = uStack_70 + 1;
    }
    puVar15 = (ushort *)(ppVar13 + 1);
    if (bVar2 < 8) {
      sVar5 = row_info->rowbytes;
      pVar1 = (png_ptr->shift).gray;
      uVar21 = 0xff;
      if (pVar1 == '\x03' && bVar2 == 4) {
        uVar21 = 0x11;
      }
      uVar20 = 0x55;
      if (bVar2 != 2 || pVar1 != '\x01') {
        uVar20 = uVar21;
      }
      for (sVar22 = 0; sVar22 != sVar5; sVar22 = sVar22 + 1) {
        uVar21 = 0;
        iVar8 = -uVar19;
        for (iVar11 = iVar18; iVar8 = uVar17 + iVar8,
            iVar11 != -uVar17 && SBORROW4(iVar11,-uVar17) == (int)(iVar11 + uVar17) < 0;
            iVar11 = iVar11 - uVar17) {
          uVar12 = (byte)((byte)*puVar15 >> ((byte)iVar8 & 0x1f)) & uVar20;
          if (0 < iVar11) {
            uVar12 = (uint)(byte)*puVar15 << ((byte)iVar11 & 0x1f);
          }
          uVar21 = uVar21 | uVar12;
        }
        *(byte *)puVar15 = (byte)uVar21;
        puVar15 = (ushort *)((long)puVar15 + 1);
      }
    }
    else {
      uVar17 = row_info->width * uStack_70;
      uVar19 = 0;
      if (bVar2 == 8) {
        for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          uVar21 = 0;
          uVar10 = (ulong)(uVar19 % uStack_70 << 2);
          iVar18 = *(int *)((long)shift_start + uVar10);
          iVar11 = *(int *)((long)local_68 + uVar10);
          iVar8 = -iVar18;
          for (; iVar18 != -iVar11 && SBORROW4(iVar18,-iVar11) == iVar18 + iVar11 < 0;
              iVar18 = iVar18 - iVar11) {
            uVar20 = (uint)(byte)((byte)*puVar15 >> ((byte)iVar8 & 0x1f));
            if (0 < iVar18) {
              uVar20 = (uint)(byte)*puVar15 << ((byte)iVar18 & 0x1f);
            }
            uVar21 = uVar21 | uVar20;
            iVar8 = iVar8 + iVar11;
          }
          *(byte *)puVar15 = (byte)uVar21;
          puVar15 = (ushort *)((long)puVar15 + 1);
        }
      }
      else {
        for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          uVar21 = 0;
          uVar7 = *puVar15 << 8 | *puVar15 >> 8;
          uVar10 = (ulong)(uVar19 % uStack_70 << 2);
          iVar18 = *(int *)((long)shift_start + uVar10);
          iVar11 = *(int *)((long)local_68 + uVar10);
          iVar8 = -iVar18;
          for (; iVar18 != -iVar11 && SBORROW4(iVar18,-iVar11) == iVar18 + iVar11 < 0;
              iVar18 = iVar18 - iVar11) {
            uVar20 = (uint)(uVar7 >> ((byte)iVar8 & 0x1f));
            if (0 < iVar18) {
              uVar20 = (uint)uVar7 << ((byte)iVar18 & 0x1f);
            }
            uVar21 = uVar21 | uVar20;
            iVar8 = iVar8 + iVar11;
          }
          *puVar15 = (ushort)uVar21 << 8 | (ushort)uVar21 >> 8;
          puVar15 = puVar15 + 1;
        }
      }
    }
    uVar19 = png_ptr->transformations;
  }
  if ((uVar19 >> 0x11 & 1) != 0) {
    ppVar13 = png_ptr->row_buf;
    if (row_info->color_type == '\x04') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          puVar15 = (ushort *)(ppVar13 + lVar16 * 2 + 1);
          *puVar15 = *puVar15 << 8 | *puVar15 >> 8;
        }
      }
      else {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          auVar23 = pshuflw(ZEXT416(*(uint *)(ppVar13 + lVar16 * 4 + 1)),
                            ZEXT416(*(uint *)(ppVar13 + lVar16 * 4 + 1)),0xe1);
          *(int *)(ppVar13 + lVar16 * 4 + 1) = auVar23._0_4_;
        }
      }
    }
    else if (row_info->color_type == '\x06') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          *(uint *)(ppVar13 + lVar16 * 4 + 1) =
               *(uint *)(ppVar13 + lVar16 * 4 + 1) << 0x18 |
               *(uint *)(ppVar13 + lVar16 * 4 + 1) >> 8;
        }
      }
      else {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(ppVar13 + lVar16 * 8 + 1);
          auVar23 = pshuflw(auVar23,auVar23,0x39);
          *(long *)(ppVar13 + lVar16 * 8 + 1) = auVar23._0_8_;
        }
      }
    }
  }
  if ((png_ptr->transformations & 0x80000) != 0) {
    ppVar13 = png_ptr->row_buf;
    if (row_info->color_type == '\x04') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          ppVar13[lVar16 * 2 + 2] = ~ppVar13[lVar16 * 2 + 2];
        }
      }
      else {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          ppVar13[lVar16 * 4 + 3] = ~ppVar13[lVar16 * 4 + 3];
          ppVar13[lVar16 * 4 + 4] = ~ppVar13[lVar16 * 4 + 4];
        }
      }
    }
    else if (row_info->color_type == '\x06') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          ppVar13[lVar16 * 4 + 4] = ~ppVar13[lVar16 * 4 + 4];
        }
      }
      else {
        for (lVar16 = 0; pVar4 != (png_uint_32)lVar16; lVar16 = lVar16 + 1) {
          ppVar13[lVar16 * 8 + 7] = ~ppVar13[lVar16 * 8 + 7];
          ppVar13[lVar16 * 8 + 8] = ~ppVar13[lVar16 * 8 + 8];
        }
      }
    }
  }
  uVar19 = png_ptr->transformations;
  if ((uVar19 & 1) != 0) {
    png_do_bgr(row_info,png_ptr->row_buf + 1);
    uVar19 = png_ptr->transformations;
  }
  if ((uVar19 & 0x20) == 0) {
    return;
  }
  png_do_invert(row_info,png_ptr->row_buf + 1);
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_write_transformations");

   if (png_ptr == NULL)
      return;

#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
      if (png_ptr->write_user_transform_fn != NULL)
         (*(png_ptr->write_user_transform_fn)) /* User write transform
                                                 function */
             (png_ptr,  /* png_ptr */
             row_info,  /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);      /* start of pixel data for row */
#endif

#ifdef PNG_WRITE_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          !(png_ptr->flags & PNG_FLAG_FILLER_AFTER));
#endif

#ifdef PNG_WRITE_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_pack(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->bit_depth);
#endif

#ifdef PNG_WRITE_SWAP_SUPPORTED
#  ifdef PNG_16BIT_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#  endif
#endif

#ifdef PNG_WRITE_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_shift(row_info, png_ptr->row_buf + 1,
           &(png_ptr->shift));
#endif

#ifdef PNG_WRITE_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_write_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_write_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif
}